

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

size_t __thiscall
pstore::file::in_memory::read_buffer(in_memory *this,not_null<void_*> ptr,size_t nbytes)

{
  uint64_t count;
  element_type *ptr_00;
  uchar *__result;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_78;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_68;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_58;
  undefined1 local_48 [8];
  span<unsigned_char,__1L> span;
  index_type pos;
  index_type length;
  long max;
  size_t nbytes_local;
  in_memory *this_local;
  not_null<void_*> ptr_local;
  
  if ((this->eof_ < this->pos_ + nbytes) || (max = nbytes, this->pos_ + nbytes < this->pos_)) {
    max = this->eof_ - this->pos_;
  }
  this_local = (in_memory *)ptr.ptr_;
  if (((this->length_ < 0x8000000000000000) && (this->pos_ < 0x8000000000000000)) &&
     ((ulong)max < 0x8000000000000000)) {
    count = this->length_;
    span.storage_.data_ = (pointer)this->pos_;
    ptr_00 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->buffer_).
                         super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>);
    local_58 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::make_span<unsigned_char>(ptr_00,count);
    _local_48 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                pstore::gsl::span<unsigned_char,_-1L>::subspan
                          ((span<unsigned_char,__1L> *)&local_58,(index_type)span.storage_.data_,max
                          );
    std::begin<pstore::gsl::span<unsigned_char,_1l>>((span<unsigned_char,__1L> *)&local_68);
    std::end<pstore::gsl::span<unsigned_char,_1l>>((span<unsigned_char,__1L> *)&local_78);
    __result = (uchar *)pstore::gsl::not_null<void_*>::get((not_null<void_*> *)&this_local);
    std::
    copy<pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>,unsigned_char*>
              (&local_68,&local_78,__result);
    if (this->pos_ <= this->pos_ + max) {
      this->pos_ = max + this->pos_;
      return max;
    }
    assert_failed("pos_ + nbytes >= pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                  ,0xcb);
  }
  assert_failed("length_ <= max && pos_ <= max && nbytes <= max",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/file.cpp"
                ,0xc1);
}

Assistant:

std::size_t in_memory::read_buffer (gsl::not_null<void *> const ptr, std::size_t nbytes) {
            // The second half of this check is to catch integer overflows.
            if (pos_ + nbytes > eof_ || pos_ + nbytes < pos_) {
                nbytes = eof_ - pos_;
            }

            using element_type = decltype (buffer_)::element_type;
            using index_type = gsl::span<decltype (buffer_)::element_type>::index_type;

#ifndef NDEBUG
            {
                constexpr auto max = std::numeric_limits<index_type>::max ();
                PSTORE_ASSERT (length_ <= max && pos_ <= max && nbytes <= max);
            }
#endif
            auto const length = static_cast<index_type> (length_);
            auto const pos = static_cast<index_type> (pos_);
            auto span = gsl::make_span (buffer_.get (), length)
                            .subspan (pos, static_cast<index_type> (nbytes));
            std::copy (std::begin (span), std::end (span),
                       static_cast<element_type *> (ptr.get ()));

            PSTORE_ASSERT (pos_ + nbytes >= pos_);
            pos_ += nbytes;
            return nbytes;
        }